

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  
LAB_001388cb:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_001388f5;
      if (s->read_from_callbacks != 0) goto LAB_001388e5;
LAB_00138911:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_0013893b;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_0013893b:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0013895e:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_001388cb;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0013895e;
            goto LAB_001388cb;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_001388cb;
        sVar1 = stbi__get8(s);
        *c = sVar1;
      } while( true );
    }
LAB_001388e5:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00138911;
LAB_001388f5:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_00138911;
    sVar1 = stbi__get8(s);
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}